

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_interface_generic.c
# Opt level: O1

os_interface_ip * os_interface_generic_get_prefix_from_dst(netaddr *destination,os_interface *os_if)

{
  list_entity *plVar1;
  char cVar2;
  avl_tree *paVar3;
  avl_tree *paVar4;
  os_interface_ip *poVar5;
  
  if (os_if == (os_interface *)0x0) {
    paVar3 = os_interface_linux_get_tree();
    do {
      paVar3 = (avl_tree *)(paVar3->list_head).next;
      plVar1 = (paVar3->list_head).prev;
      paVar4 = os_interface_linux_get_tree();
      if (plVar1 == (paVar4->list_head).prev) {
        return (os_interface_ip *)0x0;
      }
      poVar5 = os_interface_generic_get_prefix_from_dst(destination,(os_interface *)(paVar3 + -5));
    } while (poVar5 == (os_interface_ip *)0x0);
  }
  else {
    poVar5 = (os_interface_ip *)&os_if->addresses;
    do {
      poVar5 = (os_interface_ip *)(poVar5->_node).list.next;
      if ((poVar5->_node).list.prev == (os_if->addresses).list_head.prev) {
        return (os_interface_ip *)0x0;
      }
      cVar2 = netaddr_is_in_subnet(&poVar5->prefix,destination);
    } while (cVar2 == '\0');
  }
  return poVar5;
}

Assistant:

const struct os_interface_ip *
os_interface_generic_get_prefix_from_dst(struct netaddr *destination, struct os_interface *os_if) {
  const struct os_interface_ip *ip;

  if (os_if == NULL) {
    avl_for_each_element(os_interface_get_tree(), os_if, _node) {
      ip = os_interface_get_prefix_from_dst(destination, os_if);
      if (ip) {
        return ip;
      }
    }
    return NULL;
  }

  avl_for_each_element(&os_if->addresses, ip, _node) {
    if (netaddr_is_in_subnet(&ip->prefix, destination)) {
      return ip;
    }
  }

  return NULL;
}